

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O0

bool IsExpressionStatement(ParseNode *stmt,ScriptContext *scriptContext)

{
  bool bVar1;
  uint uVar2;
  ParseNodeFnc *this;
  ScriptContext *scriptContext_local;
  ParseNode *stmt_local;
  
  if (stmt->nop == knopFncDecl) {
    this = ParseNode::AsParseNodeFnc(stmt);
    bVar1 = ParseNodeFnc::IsDeclaration(this);
    stmt_local._7_1_ = (bool)((bVar1 ^ 0xffU) & 1);
  }
  else if (stmt->nop < knopLim) {
    uVar2 = ParseNode::Grfnop((uint)stmt->nop);
    stmt_local._7_1_ = (uVar2 & 0x400) == 0;
  }
  else {
    stmt_local._7_1_ = false;
  }
  return stmt_local._7_1_;
}

Assistant:

bool IsExpressionStatement(ParseNode* stmt, const Js::ScriptContext *const scriptContext)
{
    if (stmt->nop == knopFncDecl)
    {
        // 'knopFncDecl' is used for both function declarations and function expressions. In a program, a function expression
        // produces the function object that is created for the function expression as its value for the program. A function
        // declaration does not produce a value for the program.
        return !stmt->AsParseNodeFnc()->IsDeclaration();
    }
    if ((stmt->nop >= 0) && (stmt->nop<knopLim))
    {
        return (ParseNode::Grfnop(stmt->nop) & fnopNotExprStmt) == 0;
    }
    return false;
}